

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  uint uVar1;
  Bitmask BVar2;
  Bitmask BVar3;
  ulong uVar4;
  Bitmask BVar5;
  
  uVar1 = p->flags;
  if (p->op == 0xa2) {
    if ((uVar1 & 8) == 0) {
      BVar2 = sqlite3WhereGetMask(pMaskSet,p->iTable);
      return BVar2;
    }
    BVar2 = 0;
    if ((uVar1 & 0x804000) != 0) {
      return 0;
    }
  }
  else {
    if ((uVar1 & 0x804000) != 0) {
      return 0;
    }
    if (p->op == 0xab) {
      BVar2 = sqlite3WhereGetMask(pMaskSet,p->iTable);
    }
    else {
      BVar2 = 0;
    }
  }
  if (p->pLeft != (Expr *)0x0) {
    BVar3 = sqlite3WhereExprUsageNN(pMaskSet,p->pLeft);
    BVar2 = BVar2 | BVar3;
  }
  if (p->pRight == (Expr *)0x0) {
    if ((p->flags >> 0xb & 1) == 0) {
      if ((p->x).pList == (ExprList *)0x0) goto LAB_001899d9;
      uVar4 = sqlite3WhereExprListUsage(pMaskSet,(p->x).pList);
    }
    else {
      if ((p->flags & 0x20) != 0) {
        pMaskSet->bVarSelect = 1;
      }
      uVar4 = exprSelectUsage(pMaskSet,(p->x).pSelect);
    }
  }
  else {
    uVar4 = sqlite3WhereExprUsageNN(pMaskSet,p->pRight);
  }
  BVar2 = BVar2 | uVar4;
LAB_001899d9:
  if ((p->op == 0xa1) && ((p->y).pWin != (Window *)0x0)) {
    BVar3 = sqlite3WhereExprListUsage(pMaskSet,((p->y).pWin)->pPartition);
    BVar5 = sqlite3WhereExprListUsage(pMaskSet,((p->y).pWin)->pOrderBy);
    BVar2 = BVar2 | BVar5 | BVar3;
  }
  return BVar2;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  Bitmask mask;
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprHasProperty(p, EP_xIsSelect) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
#ifndef SQLITE_OMIT_WINDOWFUNC
  if( p->op==TK_FUNCTION && p->y.pWin ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pPartition);
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pOrderBy);
  }
#endif
  return mask;
}